

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  ScriptModuleType SVar2;
  pointer pSVar3;
  pointer pMVar4;
  TextScriptModule *pTVar5;
  pointer pSVar6;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar7;
  uchar *data;
  char *pcVar8;
  undefined8 uVar9;
  size_type sVar10;
  ulong uVar11;
  string *local_1d8;
  Binding local_1a0;
  Index local_178;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  Index command_index;
  string asStack_150 [32];
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  undefined8 local_f0;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  undefined8 local_d0;
  reference local_c8;
  Error *error;
  iterator __end3;
  iterator __begin3;
  Errors *__range3;
  char *filename;
  Errors errors;
  ReadBinaryOptions options;
  DataScriptModule<(wabt::ScriptModuleType)1> *bsm;
  __single_object command_1;
  __single_object command;
  Module *module;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> local_30;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  CommandPtr *out_command_local;
  Script *script_local;
  WastParser *this_local;
  
  script_module._M_t.
  super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
  super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
  super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       out_command;
  std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::
  unique_ptr<std::default_delete<wabt::ScriptModule>,void>
            ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)&local_30);
  result = ParseScriptModule(this,&local_30);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
         )(__uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>)0x0;
    pSVar3 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
             operator->(&local_30);
    SVar2 = ScriptModule::type(pSVar3);
    if (SVar2 == Text) {
      std::make_unique<wabt::ModuleCommand>();
      pMVar4 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
               operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                           *)&command_1);
      command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
            )&pMVar4->module;
      pSVar3 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pTVar5 = cast<wabt::TextScriptModule,wabt::ScriptModule>(pSVar3);
      Module::operator=((Module *)
                        command._M_t.
                        super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                        .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,
                        &pTVar5->module);
      std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
                 script_module._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &command_1);
      std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
                ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &command_1);
    }
    else if (SVar2 == Binary) {
      std::make_unique<wabt::ScriptModuleCommand>();
      pSVar6 = std::
               unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
               ::operator->((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                             *)&bsm);
      command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
            )&pSVar6->module;
      pSVar3 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pDVar7 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(pSVar3);
      ReadBinaryOptions::ReadBinaryOptions
                ((ReadBinaryOptions *)
                 &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)this->options_;
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pDVar7->data);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pDVar7->data);
      ReadBinaryIr("<text>",data,sVar10,
                   (ReadBinaryOptions *)
                   &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(Errors *)&filename,
                   (Module *)
                   command._M_t.
                   super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                   .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
      std::__cxx11::string::operator=((string *)&(pSVar6->module).name,(string *)&pDVar7->name);
      (((Module *)
       command._M_t.
       super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
       super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl)->loc).filename._M_len =
           (pDVar7->loc).filename._M_len;
      (pSVar6->module).loc.filename._M_str = (pDVar7->loc).filename._M_str;
      (pSVar6->module).loc.field_1.field_1.offset = (pDVar7->loc).field_1.field_1.offset;
      *(undefined8 *)((long)&(pSVar6->module).loc.field_1 + 8) =
           *(undefined8 *)((long)&(pDVar7->loc).field_1 + 8);
      __end3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin
                         ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      error = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end
                                 ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                         *)&error), bVar1) {
        local_c8 = __gnu_cxx::
                   __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                   ::operator*(&__end3);
        if (local_c8->error_level != Error) {
          __assert_fail("error.error_level == ErrorLevel::Error",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0xd05,"Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)"
                       );
        }
        if ((local_c8->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          local_e8 = (pDVar7->loc).filename._M_len;
          local_e0 = (pDVar7->loc).filename._M_str;
          local_d8 = (pDVar7->loc).field_1.field_1.offset;
          local_d0 = *(undefined8 *)((long)&(pDVar7->loc).field_1 + 8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          Error(this,0x35d93a,pcVar8);
        }
        else {
          local_108 = (pDVar7->loc).filename._M_len;
          local_100 = (pDVar7->loc).filename._M_str;
          local_f8 = (pDVar7->loc).field_1.field_1.offset;
          local_f0 = *(undefined8 *)((long)&(pDVar7->loc).field_1 + 8);
          pcVar8 = (char *)(local_c8->loc).field_1.field_1.offset;
          uVar9 = std::__cxx11::string::c_str();
          Error(this,0x35d955,pcVar8,uVar9);
        }
        __gnu_cxx::
        __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>::
        operator++(&__end3);
      }
      pSVar6 = std::
               unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
               ::operator->((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                             *)&bsm);
      std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::operator=
                (&pSVar6->script_module,&local_30);
      std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
                 script_module._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                  *)&bsm);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      std::unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>::
      ~unique_ptr((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                   *)&bsm);
    }
    else if (SVar2 == Quoted) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&command_index,"a binary module",&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_150,"a text module",&local_172);
      local_130 = (iterator)&command_index;
      local_128 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_173);
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_120,__l,&local_173);
      this_local._4_4_ = ErrorExpected(this,&local_120,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_173);
      local_1d8 = (string *)&local_130;
      do {
        local_1d8 = local_1d8 + -0x20;
        std::__cxx11::string::~string(local_1d8);
      } while (local_1d8 != (string *)&command_index);
      std::allocator<char>::~allocator(&local_172);
      std::allocator<char>::~allocator(&local_171);
      goto LAB_0027f14e;
    }
    if (script != (Script *)0x0) {
      sVar10 = std::
               vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ::size(&script->commands);
      local_178 = (Index)sVar10;
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        Binding::Binding(&local_1a0,
                         (Location *)
                         command._M_t.
                         super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                         .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,local_178
                        );
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&script->module_bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)command._M_t.
                          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                          .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x20),
                   &local_1a0);
      }
      this->last_module_index_ = local_178;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_0027f14e:
  std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, module);
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}